

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sproxy.cpp
# Opt level: O2

void issue_sleep_checks(void)

{
  pointer __n;
  uint uVar1;
  ulong uVar2;
  LinuxRawSocket query_socket;
  
  LinuxRawSocket::LinuxRawSocket(&query_socket);
  LinuxRawSocket::setOutputInterface(&query_socket,&interface_name_abi_cxx11_);
  uVar1 = 0;
  while( true ) {
    __n = devices.super__Vector_base<Device,_std::allocator<Device>_>._M_impl.
          super__Vector_impl_data._M_start;
    uVar2 = (ulong)uVar1;
    if ((ulong)(((long)devices.super__Vector_base<Device,_std::allocator<Device>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)devices.super__Vector_base<Device,_std::allocator<Device>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x38) <= uVar2) break;
    devices.super__Vector_base<Device,_std::allocator<Device>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar2].is_awake = false;
    arp_request._36_2_ = *(undefined2 *)(__n[uVar2].mac_address + 4);
    arp_request._32_4_ = *(undefined4 *)__n[uVar2].mac_address;
    arp_request._38_4_ = *(undefined4 *)__n[uVar2].ip_address;
    LinuxRawSocket::write(&query_socket,0x10c310,(void *)0x2a,(size_t)__n);
    uVar1 = uVar1 + 1;
  }
  LinuxRawSocket::~LinuxRawSocket(&query_socket);
  return;
}

Assistant:

void issue_sleep_checks()
{
  // Create a socket to issue requests
  LinuxRawSocket query_socket;
  query_socket.setOutputInterface(interface_name);

  // Get a pointer to the ARP section of the request
  arp_ipv4* arp_req_arp =
    (arp_ipv4*)(arp_request + sizeof(ethernet_ii_header));

  // ARP request to all devices
  for(unsigned int i = 0; i < devices.size(); i++)
  {
    // Mark the device as not awake; if it really is awake, the other thread
    // will receive a response to the coming ARP request and mark it as such
    devices[i].is_awake = false;

    // Update buffer with current device's IP and MAC
    memcpy(arp_req_arp->tha, devices[i].mac_address, 6);
    memcpy(arp_req_arp->tpa, devices[i].ip_address,  4);

    // Issue the request
    query_socket.write((const char*)arp_request,
                       sizeof(ethernet_ii_header) + sizeof(arp_ipv4));
  }
}